

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O3

string * __thiscall
Diligent::DeviceObjectArchive::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DeviceObjectArchive *this)

{
  pointer *ppSVar1;
  iterator __position;
  undefined8 *puVar2;
  long lVar3;
  void *pvVar4;
  byte bVar5;
  string *psVar6;
  byte bVar7;
  size_t sVar8;
  ostream *poVar9;
  ulong uVar10;
  long *plVar11;
  long *plVar12;
  size_type *psVar13;
  _Hash_node_base *p_Var14;
  pointer pSVar15;
  uint uVar16;
  ulong *puVar17;
  pointer pSVar18;
  char *pcVar19;
  Uint32 i;
  long lVar20;
  long lVar21;
  ulong uVar22;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *__range2;
  ulong *puVar23;
  ulong uVar24;
  DeviceObjectArchive *pDVar25;
  bool bVar26;
  char Ident1 [3];
  char Ident2 [5];
  string msg;
  char CommonDataName [7];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ShaderNames;
  char SeparatorLine [20];
  array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
  ResourcesByType;
  Serializer<(Diligent::SerializerMode)0> ShaderSer;
  stringstream Output;
  char local_36c [4];
  char local_368 [8];
  string local_360;
  long *local_340;
  long *local_338;
  DeviceObjectArchive *local_330;
  long local_328;
  char local_320 [8];
  long *local_318;
  ulong local_310;
  long local_308;
  long lStack_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  undefined2 *local_2e0;
  undefined8 local_2d8;
  undefined2 local_2d0;
  undefined6 uStack_2ce;
  string *local_2c0;
  char local_2b8 [8];
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  long lStack_2a0;
  ConstQual<ShaderCreateInfo> local_298;
  Serializer<(Diligent::SerializerMode)0> local_1d0;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  long lStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Archive contents:\n",0x12);
  builtin_strncpy(local_2b8,"--------",8);
  uStack_2b0._0_1_ = '-';
  uStack_2b0._1_1_ = '-';
  uStack_2b0._2_1_ = '-';
  uStack_2b0._3_1_ = '-';
  uStack_2b0._4_1_ = '-';
  uStack_2b0._5_1_ = '-';
  uStack_2b0._6_1_ = '-';
  uStack_2b0._7_1_ = '-';
  local_2a8 = 0xa2d2d;
  local_36c[2] = 0;
  local_36c[0] = ' ';
  local_36c[1] = ' ';
  builtin_strncpy(local_368,"    ",5);
  local_2c0 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Header\n",7);
  sVar8 = strlen(local_36c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_36c,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Archive version: ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  local_298.FilePath._0_1_ = 10;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_298,1);
  sVar8 = strlen(local_36c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_36c,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Content version: ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  local_298.FilePath = (Char *)CONCAT71(local_298.FilePath._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_298,1);
  builtin_strncpy(local_320,"Common",7);
  memset(&local_298,0,0xc0);
  for (p_Var14 = (this->m_NamedResources)._M_h._M_before_begin._M_nxt;
      p_Var14 != (_Hash_node_base *)0x0; p_Var14 = p_Var14->_M_nxt) {
    uVar10 = (ulong)*(uint *)&p_Var14[1]._M_nxt;
    __position._M_current =
         (reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>
          *)(&local_298.pShaderSourceStreamFactory)[uVar10 * 3];
    if (__position._M_current ==
        (reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>
         *)(&local_298.Source)[uVar10 * 3]) {
      std::
      vector<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>,std::allocator<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>>>
      ::
      _M_realloc_insert<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const&>
                ((vector<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>,std::allocator<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>>>
                  *)(&local_298.FilePath + uVar10 * 3),__position,
                 (pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>
                  *)(p_Var14 + 1));
    }
    else {
      (__position._M_current)->_M_data =
           (pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>
            *)(p_Var14 + 1);
      (&local_298.pShaderSourceStreamFactory)[uVar10 * 3] =
           (IShaderSourceInputStreamFactory *)(__position._M_current + 1);
    }
  }
  lVar20 = 0;
  local_330 = this;
  do {
    puVar2 = *(undefined8 **)((long)&local_298.FilePath + lVar20);
    local_328 = lVar20;
    if (puVar2 != *(undefined8 **)((long)&local_298.pShaderSourceStreamFactory + lVar20)) {
      uVar16 = *(uint *)*puVar2;
      sVar8 = strlen(local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_2b8,sVar8);
      if (uVar16 < 8) {
        pcVar19 = &DAT_0090a450 + *(int *)(&DAT_0090a450 + (ulong)uVar16 * 4);
      }
      else {
        FormatString<char[22]>(&local_360,(char (*) [22])"Unexpected chunk type");
        DebugAssertionFailed
                  (local_360._M_dataplus._M_p,"ResourceTypeToString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                   ,0x14f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        pcVar19 = "";
      }
      sVar8 = strlen(pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,")\n",2);
      plVar11 = *(long **)((long)&local_298.FilePath + local_328);
      local_340 = *(long **)((long)&local_298.pShaderSourceStreamFactory + local_328);
      if (plVar11 != local_340) {
        do {
          lVar20 = *plVar11;
          sVar8 = strlen(local_36c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_36c,sVar8);
          pcVar19 = *(char **)(lVar20 + 8);
          if (pcVar19 == (char *)0x0) {
            std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
          }
          else {
            sVar8 = strlen(pcVar19);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar8);
          }
          local_360._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_360,1);
          uVar10 = *(ulong *)(lVar20 + 0x28);
          puVar23 = (ulong *)(lVar20 + 0x48);
          uVar22 = 6;
          lVar20 = 0;
          puVar17 = puVar23;
          local_338 = plVar11;
          do {
            uVar24 = *puVar17;
            if (uVar10 <= uVar24) {
              uVar10 = uVar24;
            }
            if (uVar24 != 0) {
              pcVar19 = anon_unknown_25::ArchiveDeviceTypeToString((Uint32)lVar20);
              sVar8 = strlen(pcVar19);
              if (uVar22 <= sVar8) {
                uVar22 = sVar8;
              }
            }
            lVar20 = lVar20 + 1;
            puVar17 = puVar17 + 4;
          } while (lVar20 != 7);
          lVar20 = 1;
          if (9 < uVar10) {
            lVar20 = 0x100000000;
            do {
              lVar20 = lVar20 + 0x100000000;
              bVar26 = 99 < uVar10;
              uVar10 = uVar10 / 10;
            } while (bVar26);
            lVar20 = lVar20 >> 0x20;
          }
          sVar8 = strlen(local_368);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_368,sVar8);
          *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)(int)uVar22;
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
          sVar8 = strlen(local_320);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,sVar8);
          local_360._M_dataplus._M_p._0_1_ = 0x20;
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)&local_360,1);
          lVar21 = *(long *)poVar9;
          *(long *)(poVar9 + *(long *)(lVar21 + -0x18) + 0x10) = lVar20;
          lVar21 = *(long *)(lVar21 + -0x18);
          *(uint *)(poVar9 + lVar21 + 0x18) = *(uint *)(poVar9 + lVar21 + 0x18) & 0xffffff4f | 0x80;
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes\n",7);
          lVar21 = 0;
          do {
            if (*puVar23 != 0) {
              sVar8 = strlen(local_368);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_368,sVar8);
              *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)(int)uVar22;
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x20;
              pcVar19 = anon_unknown_25::ArchiveDeviceTypeToString((Uint32)lVar21);
              sVar8 = strlen(pcVar19);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar8)
              ;
              local_360._M_dataplus._M_p._0_1_ = 0x20;
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)&local_360,1);
              lVar3 = *(long *)poVar9;
              *(long *)(poVar9 + *(long *)(lVar3 + -0x18) + 0x10) = lVar20;
              lVar3 = *(long *)(lVar3 + -0x18);
              *(uint *)(poVar9 + lVar3 + 0x18) =
                   *(uint *)(poVar9 + lVar3 + 0x18) & 0xffffff4f | 0x80;
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes\n",7);
            }
            lVar21 = lVar21 + 1;
            puVar23 = puVar23 + 4;
          } while (lVar21 != 7);
          plVar11 = local_338 + 1;
        } while (plVar11 != local_340);
      }
    }
    pDVar25 = local_330;
    lVar20 = local_328 + 0x18;
  } while (lVar20 != 0xc0);
  lVar20 = 0xc0;
  do {
    pvVar4 = *(void **)((long)&uStack_2b0 + lVar20);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,*(long *)((long)&lStack_2a0 + lVar20) - (long)pvVar4);
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != 0);
  lVar20 = 0x40;
  bVar7 = 0;
  do {
    bVar5 = bVar7;
    bVar26 = *(long *)((long)(pDVar25->m_DeviceShaders)._M_elems + lVar20 + -0x40) !=
             *(long *)((long)(pDVar25->m_DeviceShaders)._M_elems + lVar20 + -0x38);
    lVar20 = lVar20 + 0x18;
    bVar7 = bVar5 | bVar26;
  } while (lVar20 != 0xe8);
  if ((bool)(bVar5 | bVar26)) {
    sVar8 = strlen(local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_2b8,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Compiled Shaders\n",0x11);
    pDVar25 = (DeviceObjectArchive *)&pDVar25->m_DeviceShaders;
    plVar11 = (long *)0x0;
    local_330 = pDVar25;
    do {
      if ((pDVar25->m_DeviceShaders)._M_elems[(long)plVar11 + -3].
          super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage !=
          (pDVar25->m_DeviceShaders)._M_elems[(long)plVar11 + -2].
          super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_340 = plVar11;
        sVar8 = strlen(local_36c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_36c,sVar8);
        pcVar19 = anon_unknown_25::ArchiveDeviceTypeToString((Uint32)local_340);
        sVar8 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar8);
        local_298.FilePath = (Char *)CONCAT71(local_298.FilePath._1_7_,0x28);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_298,1);
        ppSVar1 = &(pDVar25->m_DeviceShaders)._M_elems[(long)plVar11 + -3].
                   super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,")\n",2);
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&local_2f8,(long)ppSVar1[1] - (long)*ppSVar1 >> 5);
        pSVar15 = *ppSVar1;
        pSVar18 = ppSVar1[1];
        if (pSVar15 == pSVar18) {
          uVar10 = 0;
          local_338 = (long *)0x0;
          pSVar18 = pSVar15;
        }
        else {
          uVar24 = 0;
          uVar22 = 0;
          do {
            uVar10 = pSVar15->m_Size;
            if (pSVar15->m_Size < uVar22) {
              uVar10 = uVar22;
            }
            local_298.field_4.SourceLength = 0;
            local_298.Source = (Char *)0x0;
            local_298.ByteCode = (void *)0x0;
            local_298.FilePath = (Char *)0x0;
            local_298.pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)0x0;
            local_298.EntryPoint = "main";
            local_298.Macros.Elements = (ShaderMacro *)0x0;
            local_298.Macros.Count = 0;
            local_298.Desc.super_DeviceObjectAttribs.Name = (Char *)0x0;
            local_298.Desc.ShaderType = SHADER_TYPE_UNKNOWN;
            local_298.Desc.UseCombinedTextureSamplers = false;
            local_298.Desc.CombinedSamplerSuffix = "_sampler";
            local_298.MSLVersion._0_5_ = 0;
            local_298._125_8_ = 0;
            local_298.GLSLVersion.Major = 0;
            local_298.GLSLVersion.Minor = 0;
            local_298.GLESSLVersion._0_5_ = 0;
            local_298.GLESSLVersion.Minor._1_3_ = 0;
            local_298.SourceLanguage = SHADER_SOURCE_LANGUAGE_DEFAULT;
            local_298.ShaderCompiler = SHADER_COMPILER_DEFAULT;
            local_298.HLSLVersion.Major = 0;
            local_298.HLSLVersion.Minor = 0;
            local_298.GLSLExtensions = (char *)0x0;
            local_298.WebGPUEmulatedArrayIndexSuffix = (char *)0x0;
            local_1d0.m_Start = (TPointer)pSVar15->m_Ptr;
            local_1d0.m_End = local_1d0.m_Start + pSVar15->m_Size;
            local_1d0.m_Ptr = local_1d0.m_Start;
            bVar26 = ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
                               (&local_1d0,&local_298);
            if (bVar26) {
              local_2d0 = 0x27;
              local_2d8 = 1;
              local_2e0 = &local_2d0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_2e0);
              local_318 = &local_308;
              plVar12 = plVar11 + 2;
              if ((long *)*plVar11 == plVar12) {
                local_308 = *plVar12;
                lStack_300 = plVar11[3];
              }
              else {
                local_308 = *plVar12;
                local_318 = (long *)*plVar11;
              }
              local_310 = plVar11[1];
              *plVar11 = (long)plVar12;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::_M_replace_aux
                                          ((ulong)&local_318,local_310,0,'\x01');
              local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
              psVar13 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_360.field_2._M_allocated_capacity = *psVar13;
                local_360.field_2._8_8_ = plVar11[3];
              }
              else {
                local_360.field_2._M_allocated_capacity = *psVar13;
                local_360._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_360._M_string_length = plVar11[1];
              *plVar11 = (long)psVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_2f8,&local_360);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              if (local_318 != &local_308) {
                operator_delete(local_318,local_308 + 1);
              }
              if (local_2e0 != &local_2d0) {
                operator_delete(local_2e0,CONCAT62(uStack_2ce,local_2d0) + 1);
              }
            }
            else {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[24]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_2f8,(char (*) [24])"<Deserialization error>");
            }
            if (uVar24 <= local_2f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length) {
              uVar24 = local_2f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length;
            }
            pSVar15 = pSVar15 + 1;
            uVar22 = uVar10;
          } while (pSVar15 != pSVar18);
          pSVar15 = *ppSVar1;
          local_338 = (long *)(long)(int)uVar24;
          pSVar18 = ppSVar1[1];
        }
        uVar22 = (long)pSVar18 - (long)pSVar15 >> 5;
        lVar20 = 1;
        lVar21 = 1;
        if (9 < uVar22) {
          lVar21 = 0x100000000;
          do {
            lVar21 = lVar21 + 0x100000000;
            bVar26 = 99 < uVar22;
            uVar22 = uVar22 / 10;
          } while (bVar26);
          lVar21 = lVar21 >> 0x20;
        }
        if (9 < uVar10) {
          lVar20 = 0x100000000;
          do {
            lVar20 = lVar20 + 0x100000000;
            bVar26 = 99 < uVar10;
            uVar10 = uVar10 / 10;
          } while (bVar26);
          lVar20 = lVar20 >> 0x20;
        }
        if (pSVar18 != pSVar15) {
          uVar16 = 1;
          uVar10 = 0;
          do {
            sVar8 = strlen(local_368);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_368,sVar8)
            ;
            local_298.FilePath._0_1_ = 0x5b;
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)&local_298,1);
            lVar3 = *(long *)poVar9;
            *(long *)(poVar9 + *(long *)(lVar3 + -0x18) + 0x10) = lVar21;
            lVar3 = *(long *)(lVar3 + -0x18);
            *(uint *)(poVar9 + lVar3 + 0x18) = *(uint *)(poVar9 + lVar3 + 0x18) & 0xffffff4f | 0x80;
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
            lVar3 = *(long *)poVar9;
            *(long **)(poVar9 + *(long *)(lVar3 + -0x18) + 0x10) = local_338;
            lVar3 = *(long *)(lVar3 + -0x18);
            *(uint *)(poVar9 + lVar3 + 0x18) = *(uint *)(poVar9 + lVar3 + 0x18) & 0xffffff4f | 0x20;
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_2f8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus
                                       ._M_p,
                                local_2f8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length);
            local_298.FilePath = (Char *)CONCAT71(local_298.FilePath._1_7_,0x20);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_298,1)
            ;
            lVar3 = *(long *)poVar9;
            *(long *)(poVar9 + *(long *)(lVar3 + -0x18) + 0x10) = lVar20;
            lVar3 = *(long *)(lVar3 + -0x18);
            *(uint *)(poVar9 + lVar3 + 0x18) = *(uint *)(poVar9 + lVar3 + 0x18) & 0xffffff4f | 0x80;
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes\n",7);
            uVar10 = (ulong)uVar16;
            uVar16 = uVar16 + 1;
          } while (uVar10 < (ulong)((long)ppSVar1[1] - (long)*ppSVar1 >> 5));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2f8);
        plVar11 = local_340;
        pDVar25 = local_330;
      }
      plVar11 = (long *)((long)plVar11 + 1);
    } while (plVar11 != (long *)0x7);
  }
  psVar6 = local_2c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar6;
}

Assistant:

std::string DeviceObjectArchive::ToString() const
{
    std::stringstream Output;
    Output << "Archive contents:\n";

    constexpr char SeparatorLine[] = "------------------\n";
    constexpr char Ident1[]        = "  ";
    constexpr char Ident2[]        = "    ";

    // Print header
    {
        Output << "Header\n"
               << Ident1 << "Archive version: " << ArchiveVersion << '\n'
               << Ident1 << "Content version: " << m_ContentVersion << '\n';
    }

    constexpr char CommonDataName[] = "Common";

    auto GetNumFieldWidth = [](auto Number) //
    {
        size_t Width = 1;
        for (; Number >= 10; Number /= 10)
            ++Width;
        return Width;
    };

    // Print resources, e.g.:
    //
    //   ------------------
    //   Resource Signatures (1)
    //     Test PRS
    //       Common     1015 bytes
    //       OpenGL      729 bytes
    //       Direct3D11  384 bytes
    //       Direct3D12  504 bytes
    //       Vulkan      881 bytes
    {
        std::array<std::vector<std::reference_wrapper<const decltype(m_NamedResources)::value_type>>, static_cast<size_t>(ResourceType::Count)> ResourcesByType;
        for (const auto& it : m_NamedResources)
        {
            ResourcesByType[static_cast<size_t>(it.first.GetType())].emplace_back(it);
        }

        for (const auto& Resources : ResourcesByType)
        {
            if (Resources.empty())
                continue;

            const auto ResType = Resources.front().get().first.GetType();
            Output << SeparatorLine
                   << ResourceTypeToString(ResType) << " (" << Resources.size() << ")\n";
            // ------------------
            // Resource Signatures (1)

            for (const auto& res_ref : Resources)
            {
                const auto& it = res_ref.get();
                Output << Ident1 << it.first.GetName() << '\n';
                // ..Test PRS

                const auto& Res = it.second;

                auto   MaxSize       = Res.Common.Size();
                size_t MaxDevNameLen = strlen(CommonDataName);
                for (Uint32 i = 0; i < Res.DeviceSpecific.size(); ++i)
                {
                    const auto DevDataSize = Res.DeviceSpecific[i].Size();

                    MaxSize = std::max(MaxSize, DevDataSize);
                    if (DevDataSize != 0)
                        MaxDevNameLen = std::max(MaxDevNameLen, strlen(ArchiveDeviceTypeToString(i)));
                }
                const auto SizeFieldW = GetNumFieldWidth(MaxSize);

                Output << Ident2 << std::setw(static_cast<int>(MaxDevNameLen)) << std::left << CommonDataName << ' '
                       << std::setw(static_cast<int>(SizeFieldW)) << std::right << Res.Common.Size() << " bytes\n";
                // ....Common     1015 bytes

                for (Uint32 i = 0; i < Res.DeviceSpecific.size(); ++i)
                {
                    const auto DevDataSize = Res.DeviceSpecific[i].Size();
                    if (DevDataSize > 0)
                    {
                        Output << Ident2 << std::setw(static_cast<int>(MaxDevNameLen)) << std::left << ArchiveDeviceTypeToString(i) << ' '
                               << std::setw(static_cast<int>(SizeFieldW)) << std::right << DevDataSize << " bytes\n";
                        // ....OpenGL      729 bytes
                    }
                }
            }
        }
    }

    // Print shaders, e.g.
    //
    //   ------------------
    //   Shaders
    //     OpenGL(2)
    //       [0] 'Test VS' 4020 bytes
    //       [1] 'Test PS' 4020 bytes
    //     Vulkan(2)
    //       [0] 'Test VS' 8364 bytes
    //       [1] 'Test PS' 7380 bytes
    {
        bool HasShaders = false;
        for (const auto& Shaders : m_DeviceShaders)
        {
            if (!Shaders.empty())
                HasShaders = true;
        }

        if (HasShaders)
        {
            Output << SeparatorLine
                   << "Compiled Shaders\n";
            // ------------------
            // Compiled Shaders

            for (Uint32 dev = 0; dev < m_DeviceShaders.size(); ++dev)
            {
                const auto& Shaders = m_DeviceShaders[dev];
                if (Shaders.empty())
                    continue;
                Output << Ident1 << ArchiveDeviceTypeToString(dev) << '(' << Shaders.size() << ")\n";
                // ..OpenGL(2)

                std::vector<std::string> ShaderNames;
                ShaderNames.reserve(Shaders.size());

                size_t MaxSize    = 0;
                size_t MaxNameLen = 0;
                for (const auto& ShaderData : Shaders)
                {
                    MaxSize = std::max(MaxSize, ShaderData.Size());

                    ShaderCreateInfo                 ShaderCI;
                    Serializer<SerializerMode::Read> ShaderSer{ShaderData};
                    if (ShaderSerializer<SerializerMode::Read>::SerializeCI(ShaderSer, ShaderCI))
                        ShaderNames.emplace_back(std::string{'\''} + ShaderCI.Desc.Name + '\'');
                    else
                        ShaderNames.emplace_back("<Deserialization error>");
                    MaxNameLen = std::max(MaxNameLen, ShaderNames.back().size());
                }

                const auto IdxFieldW  = GetNumFieldWidth(Shaders.size());
                const auto SizeFieldW = GetNumFieldWidth(MaxSize);
                for (Uint32 idx = 0; idx < Shaders.size(); ++idx)
                {
                    Output << Ident2 << '[' << std::setw(static_cast<int>(IdxFieldW)) << std::right << idx << "] "
                           << std::setw(static_cast<int>(MaxNameLen)) << std::left << ShaderNames[idx] << ' '
                           << std::setw(static_cast<int>(SizeFieldW)) << std::right << Shaders[idx].Size() << " bytes\n";
                    // ....[0] 'Test VS' 4020 bytes
                }
            }
        }
    }

    return Output.str();
}